

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nth_valueFinalizeFunc(sqlite3_context *pCtx)

{
  sqlite3_context *pCtx_00;
  NthValueCtx *p;
  sqlite3_value *in_stack_ffffffffffffffe8;
  
  pCtx_00 = (sqlite3_context *)
            sqlite3_aggregate_context((sqlite3_context *)in_stack_ffffffffffffffe8,0);
  if ((pCtx_00 != (sqlite3_context *)0x0) && (pCtx_00->pFunc != (FuncDef *)0x0)) {
    sqlite3_result_value(pCtx_00,in_stack_ffffffffffffffe8);
    sqlite3_value_free((sqlite3_value *)0x22aff2);
    pCtx_00->pFunc = (FuncDef *)0x0;
  }
  return;
}

Assistant:

static void nth_valueFinalizeFunc(sqlite3_context *pCtx){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, 0);
  if( p && p->pValue ){
    sqlite3_result_value(pCtx, p->pValue);
    sqlite3_value_free(p->pValue);
    p->pValue = 0;
  }
}